

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O1

bool __thiscall
draco::CornerTable::Init
          (CornerTable *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *faces)

{
  pointer pIVar1;
  bool bVar2;
  pointer paVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int num_vertices;
  int local_24;
  
  ValenceCache<draco::CornerTable>::ClearValenceCache(&this->valence_cache_);
  ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate(&this->valence_cache_);
  std::
  vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ::resize((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            *)this,(long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2);
  paVar3 = (faces->vector_).
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(faces->vector_).
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
          -0x5555555555555555;
  if ((int)uVar4 != 0) {
    pIVar1 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = 0;
    uVar6 = 0;
    do {
      lVar7 = 0;
      do {
        pIVar1[(uint)(iVar5 + (int)lVar7)].value_ = paVar3->_M_elems[lVar7].value_;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 3;
      paVar3 = paVar3 + 1;
    } while (uVar6 != (uVar4 & 0xffffffff));
  }
  local_24 = -1;
  bVar2 = ComputeOppositeCorners(this,&local_24);
  if (bVar2) {
    BreakNonManifoldEdges(this);
    ComputeVertexCorners(this,local_24);
  }
  return bVar2;
}

Assistant:

bool CornerTable::Init(const IndexTypeVector<FaceIndex, FaceType> &faces) {
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  corner_to_vertex_map_.resize(faces.size() * 3);
  for (FaceIndex fi(0); fi < static_cast<uint32_t>(faces.size()); ++fi) {
    for (int i = 0; i < 3; ++i) {
      corner_to_vertex_map_[FirstCorner(fi) + i] = faces[fi][i];
    }
  }
  int num_vertices = -1;
  if (!ComputeOppositeCorners(&num_vertices)) {
    return false;
  }
  if (!BreakNonManifoldEdges()) {
    return false;
  }
  if (!ComputeVertexCorners(num_vertices)) {
    return false;
  }
  return true;
}